

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

bool __thiscall
OSSLEDDSA::generateKeyPair
          (OSSLEDDSA *this,AsymmetricKeyPair **ppKeyPair,AsymmetricParameters *parameters,
          RNG *param_4)

{
  uint uVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx_00;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  ECParameters *in_RDX;
  undefined8 *in_RSI;
  OSSLEDKeyPair *kp;
  int ret;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY *pkey;
  int nid;
  ECParameters *params;
  ByteString *in_stack_ffffffffffffffa8;
  EVP_PKEY *local_40;
  int local_34;
  ECParameters *local_30;
  ECParameters *local_20;
  undefined8 *local_18;
  bool local_1;
  
  if ((in_RSI == (undefined8 *)0x0) || (in_RDX == (ECParameters *)0x0)) {
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    uVar1 = (*(in_RDX->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[3])
                      (in_RDX,ECParameters::type);
    if ((uVar1 & 1) == 0) {
      softHSMLog(3,"generateKeyPair",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                 ,0xef,"Invalid parameters supplied for EDDSA key generation");
      local_1 = false;
    }
    else {
      local_30 = local_20;
      ECParameters::getEC(local_20);
      local_34 = OSSL::byteString2oid(in_stack_ffffffffffffffa8);
      local_40 = (EVP_PKEY *)0x0;
      ctx_00 = EVP_PKEY_CTX_new_id(local_34,(ENGINE *)0x0);
      if (ctx_00 == (EVP_PKEY_CTX *)0x0) {
        softHSMLog(3,"generateKeyPair",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                   ,0xfc,"Failed to instantiate OpenSSL EDDSA context");
        local_1 = false;
      }
      else {
        iVar2 = EVP_PKEY_keygen_init(ctx_00);
        if (iVar2 == 1) {
          iVar2 = EVP_PKEY_keygen(ctx_00,&local_40);
          if (iVar2 == 1) {
            EVP_PKEY_CTX_free(ctx_00);
            plVar4 = (long *)operator_new(0xd8);
            plVar4[0x18] = 0;
            plVar4[0x19] = 0;
            plVar4[0x16] = 0;
            plVar4[0x17] = 0;
            plVar4[0x14] = 0;
            plVar4[0x15] = 0;
            plVar4[0x12] = 0;
            plVar4[0x13] = 0;
            plVar4[0x10] = 0;
            plVar4[0x11] = 0;
            plVar4[0xe] = 0;
            plVar4[0xf] = 0;
            plVar4[0xc] = 0;
            plVar4[0xd] = 0;
            plVar4[10] = 0;
            plVar4[0xb] = 0;
            plVar4[8] = 0;
            plVar4[9] = 0;
            plVar4[6] = 0;
            plVar4[7] = 0;
            plVar4[4] = 0;
            plVar4[5] = 0;
            plVar4[2] = 0;
            plVar4[3] = 0;
            *plVar4 = 0;
            plVar4[1] = 0;
            plVar4[0x1a] = 0;
            OSSLEDKeyPair::OSSLEDKeyPair((OSSLEDKeyPair *)0x0);
            plVar5 = (long *)(**(code **)(*plVar4 + 0x18))();
            (**(code **)(*plVar5 + 0x60))(plVar5,local_40);
            plVar5 = (long *)(**(code **)(*plVar4 + 0x28))();
            (**(code **)(*plVar5 + 0x70))(plVar5,local_40);
            *local_18 = plVar4;
            EVP_PKEY_free(local_40);
            local_1 = true;
          }
          else {
            uVar3 = ERR_get_error();
            softHSMLog(3,"generateKeyPair",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                       ,0x10a,"EDDSA key generation failed (0x%08X)",uVar3);
            EVP_PKEY_CTX_free(ctx_00);
            local_1 = false;
          }
        }
        else {
          uVar3 = ERR_get_error();
          softHSMLog(3,"generateKeyPair",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                     ,0x103,"EDDSA key generation init failed (0x%08X)",uVar3);
          EVP_PKEY_CTX_free(ctx_00);
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool OSSLEDDSA::generateKeyPair(AsymmetricKeyPair** ppKeyPair, AsymmetricParameters* parameters, RNG* /*rng = NULL */)
{
	// Check parameters
	if ((ppKeyPair == NULL) ||
	    (parameters == NULL))
	{
		return false;
	}

	if (!parameters->areOfType(ECParameters::type))
	{
		ERROR_MSG("Invalid parameters supplied for EDDSA key generation");

		return false;
	}

	ECParameters* params = (ECParameters*) parameters;
	int nid = OSSL::byteString2oid(params->getEC());

	// Generate the key-pair
	EVP_PKEY* pkey = NULL;
	EVP_PKEY_CTX* ctx = EVP_PKEY_CTX_new_id(nid, NULL);
	if (ctx == NULL)
	{
		ERROR_MSG("Failed to instantiate OpenSSL EDDSA context");

		return false;
	}
	int ret = EVP_PKEY_keygen_init(ctx);
	if (ret != 1)
	{
		ERROR_MSG("EDDSA key generation init failed (0x%08X)", ERR_get_error());
		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	ret = EVP_PKEY_keygen(ctx, &pkey);
	if (ret != 1)
	{
		ERROR_MSG("EDDSA key generation failed (0x%08X)", ERR_get_error());
		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	EVP_PKEY_CTX_free(ctx);

	// Create an asymmetric key-pair object to return
	OSSLEDKeyPair* kp = new OSSLEDKeyPair();

	((OSSLEDPublicKey*) kp->getPublicKey())->setFromOSSL(pkey);
	((OSSLEDPrivateKey*) kp->getPrivateKey())->setFromOSSL(pkey);

	*ppKeyPair = kp;

	// Release the key
	EVP_PKEY_free(pkey);

	return true;
}